

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

void Extra_Truth3VarN(uint **puCanons,char ***puPhases,char **ppCounters)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  uint *__s;
  char *__s_00;
  char **__ptr;
  int local_5c;
  int i;
  int nClasses;
  int nFuncs;
  char *pCounters;
  char **uPhases;
  uint uTruth32;
  uint uPhase;
  uint uTruth;
  uint *uCanons;
  int nPhasesMax;
  char **ppCounters_local;
  char ***puPhases_local;
  uint **puCanons_local;
  
  __s = (uint *)malloc(0x400);
  memset(__s,0,0x400);
  __s_00 = (char *)malloc(0x100);
  memset(__s_00,0,0x100);
  __ptr = (char **)Extra_ArrayAlloc(0x100,8,1);
  uTruth32 = 0;
  do {
    if (0xff < uTruth32) {
      if (puCanons == (uint **)0x0) {
        if (__s != (uint *)0x0) {
          free(__s);
        }
      }
      else {
        *puCanons = __s;
      }
      if (puPhases == (char ***)0x0) {
        if (__ptr != (char **)0x0) {
          free(__ptr);
        }
      }
      else {
        *puPhases = __ptr;
      }
      if (ppCounters == (char **)0x0) {
        if (__s_00 != (char *)0x0) {
          free(__s_00);
        }
      }
      else {
        *ppCounters = __s_00;
      }
      return;
    }
    uVar3 = uTruth32 << 0x18 | uTruth32 << 0x10 | uTruth32 << 8 | uTruth32;
    if (__s[uTruth32] == 0) {
      for (local_5c = 0; local_5c < 8; local_5c = local_5c + 1) {
        uVar4 = Extra_TruthPolarize(uTruth32,local_5c,3);
        if ((__s[uVar4] == 0) && ((uTruth32 != 0 || (local_5c == 0)))) {
          __s[uVar4] = uVar3;
          *__ptr[uVar4] = (char)local_5c;
          __s_00[uVar4] = '\x01';
        }
        else {
          if (__s[uVar4] != uVar3) {
            __assert_fail("uCanons[uPhase] == uTruth32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                          ,0x30f,"void Extra_Truth3VarN(unsigned int **, char ***, char **)");
          }
          if (__s_00[uVar4] < '\b') {
            pcVar2 = __ptr[uVar4];
            cVar1 = __s_00[uVar4];
            __s_00[uVar4] = cVar1 + '\x01';
            pcVar2[(int)cVar1] = (char)local_5c;
          }
        }
      }
    }
    else if (uVar3 <= __s[uTruth32]) {
      __assert_fail("uTruth32 > uCanons[uTruth]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                    ,0x300,"void Extra_Truth3VarN(unsigned int **, char ***, char **)");
    }
    uTruth32 = uTruth32 + 1;
  } while( true );
}

Assistant:

void Extra_Truth3VarN( unsigned ** puCanons, char *** puPhases, char ** ppCounters )
{
    int nPhasesMax = 8;
    unsigned * uCanons;
    unsigned uTruth, uPhase, uTruth32;
    char ** uPhases, * pCounters;
    int nFuncs, nClasses, i;

    nFuncs  = (1 << 8);
    uCanons = ABC_ALLOC( unsigned, nFuncs );
    memset( uCanons, 0, sizeof(unsigned) * nFuncs );
    pCounters = ABC_ALLOC( char, nFuncs );
    memset( pCounters, 0, sizeof(char) * nFuncs );
    uPhases = (char **)Extra_ArrayAlloc( nFuncs, nPhasesMax, sizeof(char) );
    nClasses = 0;
    for ( uTruth = 0; uTruth < (unsigned)nFuncs; uTruth++ )
    {
        // skip already assigned
        uTruth32 = ((uTruth << 24) | (uTruth << 16) | (uTruth << 8) | uTruth);
        if ( uCanons[uTruth] )
        {
            assert( uTruth32 > uCanons[uTruth] );
            continue;
        }
        nClasses++;
        for ( i = 0; i < 8; i++ )
        {
            uPhase = Extra_TruthPolarize( uTruth, i, 3 );
            if ( uCanons[uPhase] == 0 && (uTruth || i==0) )
            {
                uCanons[uPhase]    = uTruth32;
                uPhases[uPhase][0] = i;
                pCounters[uPhase]  = 1;
            }
            else
            {
                assert( uCanons[uPhase] == uTruth32 );
                if ( pCounters[uPhase] < nPhasesMax )
                    uPhases[uPhase][ (int)pCounters[uPhase]++ ] = i;
            }
        }
    }
    if ( puCanons ) 
        *puCanons = uCanons;
    else
        ABC_FREE( uCanons );
    if ( puPhases ) 
        *puPhases = uPhases;
    else
        ABC_FREE( uPhases );
    if ( ppCounters ) 
        *ppCounters = pCounters;
    else
        ABC_FREE( pCounters );
//    printf( "The number of 3N-classes = %d.\n", nClasses );
}